

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O1

char * Vec_StrPrintF(Vec_Str_t *p,char *format,...)

{
  char in_AL;
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t __size;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_f8;
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_e8 = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f0 = &args[0].overflow_arg_area;
  local_f8 = 0x3000000010;
  __size = (long)p->nSize + 1000;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (p->nCap < (int)__size) {
    if (p->pArray == (char *)0x0) {
      pcVar3 = (char *)malloc(__size);
    }
    else {
      pcVar3 = (char *)realloc(p->pArray,__size);
    }
    p->pArray = pcVar3;
    p->nCap = (int)__size;
  }
  uVar1 = vsnprintf(p->pArray + p->nSize,1000,format,&local_f8);
  if (1000 < (int)uVar1) {
    iVar4 = uVar1 + p->nSize + 1000;
    if (p->nCap < iVar4) {
      if (p->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc((long)iVar4);
      }
      else {
        pcVar3 = (char *)realloc(p->pArray,(long)iVar4);
      }
      p->pArray = pcVar3;
      p->nCap = iVar4;
    }
    uVar2 = vsnprintf(p->pArray + p->nSize,(ulong)uVar1,format,&local_f8);
    if (uVar2 != uVar1) {
      __assert_fail("nSize == nAdded",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                    ,0x2c1,"char *Vec_StrPrintF(Vec_Str_t *, const char *, ...)");
    }
  }
  iVar4 = p->nSize + uVar1;
  p->nSize = iVar4;
  return p->pArray + ((long)iVar4 - (long)(int)uVar1);
}

Assistant:

static inline char * Vec_StrPrintF( Vec_Str_t * p, const char * format, ... )
{
    int nAdded, nSize = 1000; 
    va_list args;  va_start( args, format );
    Vec_StrGrow( p, Vec_StrSize(p) + nSize );
    nAdded = vsnprintf( Vec_StrLimit(p), nSize, format, args );
    if ( nAdded > nSize )
    {
        Vec_StrGrow( p, Vec_StrSize(p) + nAdded + nSize );
        nSize = vsnprintf( Vec_StrLimit(p), nAdded, format, args );
        assert( nSize == nAdded );
    }
    p->nSize += nAdded;
    va_end( args );
    return Vec_StrLimit(p) - nAdded;
}